

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall
amrex::FillPatchIteratorHelper::FillPatchIteratorHelper
          (FillPatchIteratorHelper *this,AmrLevel *amrlevel,MultiFab *leveldata,int boxGrow,
          Real time,int index,int scomp,int ncomp,InterpBase *mapper)

{
  _Rb_tree_header *p_Var1;
  allocator_type local_39;
  Real local_38;
  
  this->m_amrlevel = amrlevel;
  this->m_leveldata = leveldata;
  local_38 = time;
  MultiFabCopyDescriptor::MultiFabCopyDescriptor(&this->m_mfcd);
  std::
  vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  ::vector(&(this->m_mfid).
            super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
           ,(long)this->m_amrlevel->level + 1,&local_39);
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_ba)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_time = local_38;
  this->m_growsize = boxGrow;
  this->m_index = index;
  this->m_scomp = scomp;
  this->m_ncomp = ncomp;
  p_Var1 = &(this->m_fbox)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_cbox)._M_t._M_impl.super__Rb_tree_header;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_fbid)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Initialize(this,boxGrow,local_38,index,scomp,ncomp,mapper);
  return;
}

Assistant:

FillPatchIteratorHelper::FillPatchIteratorHelper (AmrLevel&     amrlevel,
                                                  MultiFab&     leveldata,
                                                  int           boxGrow,
                                                  Real          time,
                                                  int           index,
                                                  int           scomp,
                                                  int           ncomp,
                                                  InterpBase*   mapper)
    :
    m_amrlevel(amrlevel),
    m_leveldata(leveldata),
    m_mfid(m_amrlevel.level+1),
    m_time(time),
    m_growsize(boxGrow),
    m_index(index),
    m_scomp(scomp),
    m_ncomp(ncomp)
{
    Initialize(boxGrow,time,index,scomp,ncomp,mapper);
}